

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void WasmCGenCompare(WasmCGen *cgen,PCSTR type,PCSTR cmp,PCSTR b)

{
  PCSTR pcVar1;
  PCSTR type_00;
  PCSTR this;
  bool local_162;
  allocator<char> local_161;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  PCSTR local_28;
  PCSTR b_local;
  PCSTR cmp_local;
  PCSTR type_local;
  WasmCGen *cgen_local;
  
  local_28 = b;
  b_local = cmp;
  cmp_local = type;
  type_local = (PCSTR)cgen;
  printf("/*%s*/\n","WasmCGenCompare");
  this = type_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"(",&local_c9);
  pcVar1 = cmp_local;
  w3SourceGen::pop_abi_cxx11_(&local_120,(w3SourceGen *)type_local);
  WasmCGenCast(&local_100,pcVar1,&local_120);
  std::operator+(&local_a8,&local_c8,&local_100);
  std::operator+(&local_88,&local_a8,b_local);
  type_00 = cmp_local;
  pcVar1 = local_28;
  local_162 = local_28 == (char *)0x0;
  if (local_162) {
    w3SourceGen::pop_abi_cxx11_(&local_160,(w3SourceGen *)type_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar1,&local_161);
  }
  local_162 = !local_162;
  WasmCGenCast(&local_140,type_00,&local_160);
  std::operator+(&local_68,&local_88,&local_140);
  std::operator+(&local_48,&local_68,")");
  w3SourceGen::push((w3SourceGen *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  if (local_162) {
    std::allocator<char>::~allocator(&local_161);
  }
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  return;
}

Assistant:

void WasmCGenCompare (WasmCGen* cgen, PCSTR type, PCSTR cmp, PCSTR b = 0)
{
    printf ("/*%s*/\n", __func__);
    cgen->push (string ("(") + WasmCGenCast (type, cgen->pop ()) + cmp + WasmCGenCast (type, b ? b : cgen->pop ()) + ")");
}